

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emap.c
# Opt level: O1

void duckdb_je_emap_merge_commit
               (tsdn_t *tsdn,emap_t *emap,emap_prepare_t *prepare,edata_t *lead,edata_t *trail)

{
  rtree_leaf_elm_t *prVar1;
  ulong uVar2;
  void *pvVar3;
  rtree_leaf_elm_t **pprVar4;
  
  uVar2 = 0xe8000000000000;
  if (prepare->lead_elm_b != (rtree_leaf_elm_t *)0x0) {
    (prepare->lead_elm_b->le_bits).repr = (void *)0xe8000000000000;
  }
  pprVar4 = &prepare->trail_elm_a;
  if (prepare->trail_elm_b != (rtree_leaf_elm_t *)0x0) {
    prVar1 = *pprVar4;
    pprVar4 = &prepare->trail_elm_b;
    (prVar1->le_bits).repr = (void *)0xe8000000000000;
  }
  prVar1 = *pprVar4;
  if (lead != (edata_t *)0x0) {
    uVar2 = (ulong)((uint)(lead->e_bits >> 0xf) & 0x1c | (uint)(lead->e_bits >> 0x2b) & 2) |
            0xe8000000000000;
  }
  pvVar3 = (void *)((ulong)lead & 0xffffffffffff | uVar2);
  (prepare->lead_elm_a->le_bits).repr = pvVar3;
  if (prVar1 != (rtree_leaf_elm_t *)0x0) {
    (prVar1->le_bits).repr = pvVar3;
  }
  return;
}

Assistant:

void
emap_merge_commit(tsdn_t *tsdn, emap_t *emap, emap_prepare_t *prepare,
    edata_t *lead, edata_t *trail) {
	rtree_contents_t clear_contents;
	clear_contents.edata = NULL;
	clear_contents.metadata.szind = SC_NSIZES;
	clear_contents.metadata.slab = false;
	clear_contents.metadata.is_head = false;
	clear_contents.metadata.state = (extent_state_t)0;

	if (prepare->lead_elm_b != NULL) {
		rtree_leaf_elm_write(tsdn, &emap->rtree,
		    prepare->lead_elm_b, clear_contents);
	}

	rtree_leaf_elm_t *merged_b;
	if (prepare->trail_elm_b != NULL) {
		rtree_leaf_elm_write(tsdn, &emap->rtree,
		    prepare->trail_elm_a, clear_contents);
		merged_b = prepare->trail_elm_b;
	} else {
		merged_b = prepare->trail_elm_a;
	}

	emap_rtree_write_acquired(tsdn, emap, prepare->lead_elm_a, merged_b,
	    lead, SC_NSIZES, false);
}